

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O0

void __thiscall
xray_re::xr_partition::load_0(xr_partition *this,xr_reader *r,xr_bone_vec *all_bones)

{
  uint32_t uVar1;
  const_reference ppxVar2;
  string *__x;
  ulong local_28;
  uint_fast32_t n;
  xr_bone_vec *all_bones_local;
  xr_reader *r_local;
  xr_partition *this_local;
  
  xr_reader::r_sz(r,&this->m_name);
  uVar1 = xr_reader::r_u32(r);
  for (local_28 = (ulong)uVar1; local_28 != 0; local_28 = local_28 - 1) {
    uVar1 = xr_reader::r_u32(r);
    ppxVar2 = std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::at
                        (all_bones,(ulong)uVar1);
    __x = xr_bone::name_abi_cxx11_(*ppxVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_bones,__x);
  }
  return;
}

Assistant:

void xr_partition::load_0(xr_reader& r, const xr_bone_vec& all_bones)
{
	r.r_sz(m_name);
	for (uint_fast32_t n = r.r_u32(); n; --n)
		m_bones.push_back(all_bones.at(r.r_u32())->name());
}